

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrORA0x0d(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  ORA(this,argument);
  return 4;
}

Assistant:

int CPU::instrORA0x0d() {
	ORA(absolute_addr());
	return 4;
}